

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rehash.cpp
# Opt level: O3

void __thiscall Jupiter::Rehashable::~Rehashable(Rehashable *this)

{
  list<Jupiter::Rehashable_*,_std::allocator<Jupiter::Rehashable_*>_> *plVar1;
  
  this->_vptr_Rehashable = (_func_int **)&PTR___cxa_pure_virtual_001467e8;
  plVar1 = &o_rehashables_abi_cxx11_;
  do {
    plVar1 = (list<Jupiter::Rehashable_*,_std::allocator<Jupiter::Rehashable_*>_> *)
             (plVar1->
             super__List_base<Jupiter::Rehashable_*,_std::allocator<Jupiter::Rehashable_*>_>).
             _M_impl._M_node.super__List_node_base._M_next;
    if (plVar1 == &o_rehashables_abi_cxx11_) {
      return;
    }
  } while (*(Rehashable **)((long)plVar1 + 0x10) != this);
  o_rehashables_abi_cxx11_.
  super__List_base<Jupiter::Rehashable_*,_std::allocator<Jupiter::Rehashable_*>_>._M_impl._M_node.
  _M_size = o_rehashables_abi_cxx11_.
            super__List_base<Jupiter::Rehashable_*,_std::allocator<Jupiter::Rehashable_*>_>._M_impl.
            _M_node._M_size - 1;
  std::__detail::_List_node_base::_M_unhook();
  operator_delete(plVar1,0x18);
  return;
}

Assistant:

Jupiter::Rehashable::~Rehashable()
{
	for (auto node = o_rehashables.begin(); node != o_rehashables.end(); ++node)
	{
		if (*node == this)
		{
			o_rehashables.erase(node);
			break;
		}
	}
}